

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh new_object(qpdf_data qpdf,QPDFObjectHandle *qoh)

{
  __shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2> *this;
  qpdf_oh oh;
  qpdf_oh local_24;
  __shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_24 = qpdf->next_oh + 1;
  qpdf->next_oh = local_24;
  std::make_shared<QPDFObjectHandle,QPDFObjectHandle_const&>((QPDFObjectHandle *)&local_20);
  this = &std::
          map<unsigned_int,_std::shared_ptr<QPDFObjectHandle>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>_>_>
          ::operator[](&qpdf->oh_cache,&local_24)->
          super___shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2>::operator=(this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return local_24;
}

Assistant:

static qpdf_oh
new_object(qpdf_data qpdf, QPDFObjectHandle const& qoh)
{
    qpdf_oh oh = ++qpdf->next_oh; // never return 0
    qpdf->oh_cache[oh] = std::make_shared<QPDFObjectHandle>(qoh);
    return oh;
}